

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::Orphan<capnp::DynamicValue>_> * __thiscall
capnp::compiler::ValueTranslator::compileValue
          (Maybe<capnp::Orphan<capnp::DynamicValue>_> *__return_storage_ptr__,ValueTranslator *this,
          Reader src,Type type)

{
  ErrorReporter *pEVar1;
  Type type_00;
  Type TVar2;
  Type TVar3;
  Reader src_00;
  char cVar4;
  byte bVar5;
  bool bVar6;
  Which WVar7;
  short sVar8;
  unsigned_short uVar9;
  Which WVar10;
  Type TVar11;
  int iVar12;
  uint uVar13;
  ReaderFor<long> RVar14;
  ReaderFor<unsigned_long> RVar15;
  Orphan<capnp::DynamicValue> *pOVar16;
  char (*in_R8) [2];
  ReaderFor<capnp::DynamicEnum> RVar17;
  String local_3f0;
  String local_3d8;
  ArrayPtr<const_char> local_3c0;
  Fault local_3b0;
  Fault f_1;
  Fault f;
  Reader local_398;
  ReaderFor<capnp::DynamicStruct> local_350;
  Schema local_318;
  Schema local_310;
  Schema local_308;
  uint16_t local_300;
  Reader local_2f8;
  DynamicEnum local_2b0;
  Schema local_2a0;
  Type local_298;
  Reader local_288;
  ReaderFor<capnp::DynamicList> local_240;
  Type local_200;
  Orphan<capnp::DynamicValue> local_1f0;
  ArrayPtr<const_char> local_1b8;
  Reader local_1a8;
  ulong local_160;
  uint64_t maxValue;
  ArrayPtr<const_char> local_120;
  ulong local_110;
  int64_t minValue;
  ReaderFor<long> local_c0;
  int64_t value;
  ValueTranslator *local_a8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  undefined1 local_60 [8];
  Orphan<capnp::DynamicValue> result;
  ValueTranslator *this_local;
  Type type_local;
  
  src_00._reader = src._reader;
  aStack_a0 = type.field_4;
  local_a8 = type._0_8_;
  local_78 = src._reader.dataSize;
  SStack_74 = src._reader.pointerCount;
  uStack_72 = src._reader._38_2_;
  iStack_70 = src._reader.nestingLimit;
  uStack_6c = src._reader._44_4_;
  local_88 = src._reader.data;
  pWStack_80 = src._reader.pointers;
  local_98 = src._reader.segment;
  pCStack_90 = src._reader.capTable;
  result.builder.location = (word *)this;
  this_local = local_a8;
  type_local._0_8_ = aStack_a0.scopeId;
  type_local.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)__return_storage_ptr__;
  compileValueInner((Orphan<capnp::DynamicValue> *)local_60,this,src_00,type);
  TVar11 = Orphan<capnp::DynamicValue>::getType((Orphan<capnp::DynamicValue> *)local_60);
  TVar3.field_4.schema = local_200.field_4.schema;
  TVar3.baseType = local_200.baseType;
  TVar3.listDepth = local_200.listDepth;
  TVar3.isImplicitParam = local_200.isImplicitParam;
  TVar3.field_3 = local_200.field_3;
  TVar3._6_2_ = local_200._6_2_;
  TVar2.field_4.schema = local_298.field_4.schema;
  TVar2.baseType = local_298.baseType;
  TVar2.listDepth = local_298.listDepth;
  TVar2.isImplicitParam = local_298.isImplicitParam;
  TVar2.field_3 = local_298.field_3;
  TVar2._6_2_ = local_298._6_2_;
  switch(TVar11) {
  case UNKNOWN:
    kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,(void *)0x0);
    goto LAB_0024aaed;
  case VOID:
    bVar6 = capnp::Type::isVoid((Type *)&this_local);
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (bVar6) {
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case BOOL:
    bVar6 = capnp::Type::isBool((Type *)&this_local);
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (bVar6) {
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader
              ((Reader *)&minValue,(Orphan<capnp::DynamicValue> *)local_60);
    RVar14 = DynamicValue::Reader::as<long>((Reader *)&minValue);
    DynamicValue::Reader::~Reader((Reader *)&minValue);
    local_c0 = RVar14;
    if (-1 < RVar14) goto switchD_00249c43_caseD_4;
    local_110 = 1;
    WVar7 = capnp::Type::which((Type *)&this_local);
    switch(WVar7) {
    case INT8:
      cVar4 = kj::MinValue_::operator_cast_to_signed_char((MinValue_ *)&kj::minValue);
      local_110 = (ulong)cVar4;
      break;
    case INT16:
      sVar8 = kj::MinValue_::operator_cast_to_short((MinValue_ *)&kj::minValue);
      local_110 = (ulong)sVar8;
      break;
    case INT32:
      iVar12 = kj::MinValue_::operator_cast_to_int((MinValue_ *)&kj::minValue);
      local_110 = (ulong)iVar12;
      break;
    case INT64:
      local_110 = kj::MinValue_::operator_cast_to_long((MinValue_ *)&kj::minValue);
      break;
    case UINT8:
      bVar5 = kj::MinValue_::operator_cast_to_unsigned_char((MinValue_ *)&kj::minValue);
      local_110 = (ulong)bVar5;
      break;
    case UINT16:
      uVar9 = kj::MinValue_::operator_cast_to_unsigned_short((MinValue_ *)&kj::minValue);
      local_110 = (ulong)uVar9;
      break;
    case UINT32:
      uVar13 = kj::MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&kj::minValue);
      local_110 = (ulong)uVar13;
      break;
    case UINT64:
      local_110 = kj::MinValue_::operator_cast_to_unsigned_long((MinValue_ *)&kj::minValue);
      break;
    case FLOAT32:
    case FLOAT64:
      local_110 = kj::MinValue_::operator_cast_to_long((MinValue_ *)&kj::minValue);
    }
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (local_110 != 1) {
      if (local_c0 < (long)local_110) {
        pEVar1 = this->errorReporter;
        kj::StringPtr::StringPtr((StringPtr *)&local_120,"Integer value out of range.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar1,&src,(StringPtr)local_120);
        Orphan<capnp::DynamicValue>::Orphan((Orphan<capnp::DynamicValue> *)&maxValue,local_110);
        Orphan<capnp::DynamicValue>::operator=
                  ((Orphan<capnp::DynamicValue> *)local_60,(Orphan<capnp::DynamicValue> *)&maxValue)
        ;
        Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)&maxValue);
      }
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case UINT:
switchD_00249c43_caseD_4:
    local_160 = 0;
    WVar7 = capnp::Type::which((Type *)&this_local);
    switch(WVar7) {
    case INT8:
      cVar4 = kj::MaxValue_::operator_cast_to_signed_char((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)cVar4;
      break;
    case INT16:
      sVar8 = kj::MaxValue_::operator_cast_to_short((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)sVar8;
      break;
    case INT32:
      iVar12 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)iVar12;
      break;
    case INT64:
      local_160 = kj::MaxValue_::operator_cast_to_long((MaxValue_ *)&kj::maxValue);
      break;
    case UINT8:
      bVar5 = kj::MaxValue_::operator_cast_to_unsigned_char((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)bVar5;
      break;
    case UINT16:
      uVar9 = kj::MaxValue_::operator_cast_to_unsigned_short((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)uVar9;
      break;
    case UINT32:
      uVar13 = kj::MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
      local_160 = (ulong)uVar13;
      break;
    case UINT64:
      local_160 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
      break;
    case FLOAT32:
    case FLOAT64:
      local_160 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
    }
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (local_160 != 0) {
      Orphan<capnp::DynamicValue>::getReader(&local_1a8,(Orphan<capnp::DynamicValue> *)local_60);
      RVar15 = DynamicValue::Reader::as<unsigned_long>(&local_1a8);
      bVar6 = local_160 < RVar15;
      DynamicValue::Reader::~Reader(&local_1a8);
      if (bVar6) {
        pEVar1 = this->errorReporter;
        kj::StringPtr::StringPtr((StringPtr *)&local_1b8,"Integer value out of range.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar1,&src,(StringPtr)local_1b8);
        Orphan<capnp::DynamicValue>::Orphan(&local_1f0,local_160);
        Orphan<capnp::DynamicValue>::operator=((Orphan<capnp::DynamicValue> *)local_60,&local_1f0);
        Orphan<capnp::DynamicValue>::~Orphan(&local_1f0);
      }
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case FLOAT:
    bVar6 = capnp::Type::isFloat32((Type *)&this_local);
    if (!bVar6) {
      bVar6 = capnp::Type::isFloat64((Type *)&this_local);
      TVar3.field_4.schema = local_200.field_4.schema;
      TVar3.baseType = local_200.baseType;
      TVar3.listDepth = local_200.listDepth;
      TVar3.isImplicitParam = local_200.isImplicitParam;
      TVar3.field_3 = local_200.field_3;
      TVar3._6_2_ = local_200._6_2_;
      TVar2.field_4.schema = local_298.field_4.schema;
      TVar2.baseType = local_298.baseType;
      TVar2.listDepth = local_298.listDepth;
      TVar2.isImplicitParam = local_298.isImplicitParam;
      TVar2.field_3 = local_298.field_3;
      TVar2._6_2_ = local_298._6_2_;
      if (!bVar6) break;
    }
    pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
    kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
    goto LAB_0024aaed;
  case TEXT:
    bVar6 = capnp::Type::isText((Type *)&this_local);
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (bVar6) {
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case DATA:
    bVar6 = capnp::Type::isData((Type *)&this_local);
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    if (bVar6) {
      pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>((Orphan<capnp::DynamicValue> *)local_60);
      kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
      goto LAB_0024aaed;
    }
    break;
  case LIST:
    bVar6 = capnp::Type::isList((Type *)&this_local);
    if (bVar6) {
      Orphan<capnp::DynamicValue>::getReader(&local_288,(Orphan<capnp::DynamicValue> *)local_60);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_240,&local_288);
      local_200 = (Type)DynamicList::Reader::getSchema(&local_240);
      local_298 = (Type)capnp::Type::asList((Type *)&this_local);
      bVar6 = ListSchema::operator==((ListSchema *)&local_200,(ListSchema *)&local_298);
      DynamicValue::Reader::~Reader(&local_288);
      TVar2 = local_298;
      TVar3 = local_200;
      if (bVar6) {
        pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                            ((Orphan<capnp::DynamicValue> *)local_60);
        kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
        goto LAB_0024aaed;
      }
    }
    else {
      bVar6 = capnp::Type::isAnyPointer((Type *)&this_local);
      if (bVar6) {
        WVar10 = capnp::Type::whichAnyPointerKind((Type *)&this_local);
        switch(WVar10) {
        case ANY_KIND:
        case LIST:
          pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                              ((Orphan<capnp::DynamicValue> *)local_60);
          kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
          goto LAB_0024aaed;
        case STRUCT:
        case CAPABILITY:
        }
      }
      TVar3.field_4.schema = local_200.field_4.schema;
      TVar3.baseType = local_200.baseType;
      TVar3.listDepth = local_200.listDepth;
      TVar3.isImplicitParam = local_200.isImplicitParam;
      TVar3.field_3 = local_200.field_3;
      TVar3._6_2_ = local_200._6_2_;
      TVar2.field_4.schema = local_298.field_4.schema;
      TVar2.baseType = local_298.baseType;
      TVar2.listDepth = local_298.listDepth;
      TVar2.isImplicitParam = local_298.isImplicitParam;
      TVar2.field_3 = local_298.field_3;
      TVar2._6_2_ = local_298._6_2_;
    }
    break;
  case ENUM:
    bVar6 = capnp::Type::isEnum((Type *)&this_local);
    if (bVar6) {
      Orphan<capnp::DynamicValue>::getReader(&local_2f8,(Orphan<capnp::DynamicValue> *)local_60);
      RVar17 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_2f8);
      local_308.raw = (RawBrandedSchema *)RVar17.schema.super_Schema.raw;
      local_300 = RVar17.value;
      local_2b0.schema.super_Schema.raw = (Schema)(Schema)local_308.raw;
      local_2b0.value = local_300;
      local_2a0.raw = (RawBrandedSchema *)DynamicEnum::getSchema(&local_2b0);
      local_310.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&this_local);
      bVar6 = Schema::operator==(&local_2a0,&local_310);
      DynamicValue::Reader::~Reader(&local_2f8);
      if (bVar6) {
        pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                            ((Orphan<capnp::DynamicValue> *)local_60);
        kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
        goto LAB_0024aaed;
      }
    }
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    break;
  case STRUCT:
    bVar6 = capnp::Type::isStruct((Type *)&this_local);
    if (bVar6) {
      Orphan<capnp::DynamicValue>::getReader(&local_398,(Orphan<capnp::DynamicValue> *)local_60);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_350,&local_398);
      local_318.raw = (RawBrandedSchema *)DynamicStruct::Reader::getSchema(&local_350);
      f.exception = (Exception *)capnp::Type::asStruct((Type *)&this_local);
      bVar6 = Schema::operator==(&local_318,(Schema *)&f);
      DynamicValue::Reader::~Reader(&local_398);
      if (bVar6) {
        pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                            ((Orphan<capnp::DynamicValue> *)local_60);
        kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
        goto LAB_0024aaed;
      }
    }
    else {
      bVar6 = capnp::Type::isAnyPointer((Type *)&this_local);
      if ((bVar6) && (WVar10 = capnp::Type::whichAnyPointerKind((Type *)&this_local), WVar10 < LIST)
         ) {
        pOVar16 = kj::mv<capnp::Orphan<capnp::DynamicValue>>
                            ((Orphan<capnp::DynamicValue> *)local_60);
        kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,pOVar16);
        goto LAB_0024aaed;
      }
    }
    TVar3.field_4.schema = local_200.field_4.schema;
    TVar3.baseType = local_200.baseType;
    TVar3.listDepth = local_200.listDepth;
    TVar3.isImplicitParam = local_200.isImplicitParam;
    TVar3.field_3 = local_200.field_3;
    TVar3._6_2_ = local_200._6_2_;
    TVar2.field_4.schema = local_298.field_4.schema;
    TVar2.baseType = local_298.baseType;
    TVar2.listDepth = local_298.listDepth;
    TVar2.isImplicitParam = local_298.isImplicitParam;
    TVar2.field_3 = local_298.field_3;
    TVar2._6_2_ = local_298._6_2_;
    break;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb14,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f_1);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb17,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&local_3b0);
  }
  pEVar1 = this->errorReporter;
  type_00.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)type_local._0_8_;
  type_00._0_8_ = this_local;
  local_298 = TVar2;
  local_200 = TVar3;
  makeTypeName(&local_3f0,this,type_00);
  kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
            (&local_3d8,(kj *)"Type mismatch; expected ",(char (*) [25])&local_3f0,
             (String *)0x326243,in_R8);
  kj::StringPtr::StringPtr((StringPtr *)&local_3c0,&local_3d8);
  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar1,&src,(StringPtr)local_3c0);
  kj::String::~String(&local_3d8);
  kj::String::~String(&local_3f0);
  kj::Maybe<capnp::Orphan<capnp::DynamicValue>_>::Maybe(__return_storage_ptr__,(void *)0x0);
LAB_0024aaed:
  value._0_4_ = 1;
  Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<DynamicValue>> ValueTranslator::compileValue(Expression::Reader src, Type type) {
  Orphan<DynamicValue> result = compileValueInner(src, type);

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      // Error already reported.
      return nullptr;

    case DynamicValue::VOID:
      if (type.isVoid()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::BOOL:
      if (type.isBool()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue = 1;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: break;
        }
        if (minValue == 1) break;

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return kj::mv(result);
      }

    } // fallthrough -- value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue = 0;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: break;
      }
      if (maxValue == 0) break;

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return kj::mv(result);
    }

    case DynamicValue::FLOAT:
      if (type.isFloat32() || type.isFloat64()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::TEXT:
      if (type.isText()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::DATA:
      if (type.isData()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::LIST:
      if (type.isList()) {
        if (result.getReader().as<DynamicList>().getSchema() == type.asList()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::ENUM:
      if (type.isEnum()) {
        if (result.getReader().as<DynamicEnum>().getSchema() == type.asEnum()) {
          return kj::mv(result);
        }
      }
      break;

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        if (result.getReader().as<DynamicStruct>().getSchema() == type.asStruct()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
  return nullptr;
}